

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

_Bool get_token(HttpProxyNegotiator *s)

{
  _Bool _Var1;
  byte local_22;
  _Bool local_21;
  ulong local_20;
  size_t pos;
  HttpProxyNegotiator *s_local;
  
  local_20 = s->header_pos;
  while( true ) {
    local_21 = false;
    if (local_20 < s->header->len) {
      local_21 = is_whitespace(s->header->s[local_20]);
    }
    if (local_21 == false) break;
    local_20 = local_20 + 1;
  }
  if (local_20 == s->header->len) {
    s_local._7_1_ = false;
  }
  else {
    _Var1 = is_separator(s->header->s[local_20]);
    if (_Var1) {
      s_local._7_1_ = false;
    }
    else {
      strbuf_clear(s->token);
      while( true ) {
        local_22 = 0;
        if (local_20 < s->header->len) {
          _Var1 = is_whitespace(s->header->s[local_20]);
          local_22 = 0;
          if (!_Var1) {
            _Var1 = is_separator(s->header->s[local_20]);
            local_22 = _Var1 ^ 0xff;
          }
        }
        if ((local_22 & 1) == 0) break;
        BinarySink_put_byte(s->token->binarysink_,s->header->s[local_20]);
        local_20 = local_20 + 1;
      }
      s->header_pos = local_20;
      s_local._7_1_ = true;
    }
  }
  return s_local._7_1_;
}

Assistant:

static bool get_token(HttpProxyNegotiator *s)
{
    size_t pos = s->header_pos;

    while (pos < s->header->len && is_whitespace(s->header->s[pos]))
        pos++;

    if (pos == s->header->len)
        return false;                  /* end of string */

    if (is_separator(s->header->s[pos]))
        return false;

    strbuf_clear(s->token);
    while (pos < s->header->len &&
           !is_whitespace(s->header->s[pos]) &&
           !is_separator(s->header->s[pos]))
        put_byte(s->token, s->header->s[pos++]);

    s->header_pos = pos;
    return true;
}